

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dyndep_parser_test.cc
# Opt level: O3

void __thiscall DyndepParserTestImplicitOuts::Run(DyndepParserTestImplicitOuts *this)

{
  _Rb_tree_header *p_Var1;
  Edge *pEVar2;
  Test *pTVar3;
  bool bVar4;
  int iVar5;
  _Base_ptr p_Var6;
  _Base_ptr p_Var7;
  _Base_ptr p_Var8;
  
  iVar5 = g_current_test->assertion_failures_;
  DyndepParserTest::AssertParse
            (&this->super_DyndepParserTest,
             "ninja_dyndep_version = 1\nbuild out | impout1 impout2 : dyndep\n");
  if (iVar5 == g_current_test->assertion_failures_) {
    testing::Test::Check
              (g_current_test,
               (this->super_DyndepParserTest).dyndep_file_.
               super_map<Edge_*,_Dyndeps,_std::less<Edge_*>,_std::allocator<std::pair<Edge_*const,_Dyndeps>_>_>
               ._M_t._M_impl.super__Rb_tree_header._M_node_count == 1,
               "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/dyndep_parser_test.cc"
               ,0x1af,"1u == dyndep_file_.size()");
    p_Var6 = *(_Base_ptr *)
              ((long)&(this->super_DyndepParserTest).dyndep_file_.
                      super_map<Edge_*,_Dyndeps,_std::less<Edge_*>,_std::allocator<std::pair<Edge_*const,_Dyndeps>_>_>
                      ._M_t._M_impl.super__Rb_tree_header._M_header + 8);
    p_Var1 = &(this->super_DyndepParserTest).dyndep_file_.
              super_map<Edge_*,_Dyndeps,_std::less<Edge_*>,_std::allocator<std::pair<Edge_*const,_Dyndeps>_>_>
              ._M_t._M_impl.super__Rb_tree_header;
    p_Var8 = &p_Var1->_M_header;
    if (p_Var6 != (_Base_ptr)0x0) {
      pEVar2 = *(this->super_DyndepParserTest).state_.edges_.
                super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.super__Vector_impl_data.
                _M_start;
      p_Var7 = &p_Var1->_M_header;
      do {
        if (*(Edge **)(p_Var6 + 1) >= pEVar2) {
          p_Var7 = p_Var6;
        }
        p_Var6 = (&p_Var6->_M_left)[*(Edge **)(p_Var6 + 1) < pEVar2];
      } while (p_Var6 != (_Base_ptr)0x0);
      if (((_Rb_tree_header *)p_Var7 != p_Var1) &&
         (p_Var8 = p_Var7, pEVar2 < *(Edge **)(p_Var7 + 1))) {
        p_Var8 = &p_Var1->_M_header;
      }
    }
    bVar4 = testing::Test::Check
                      (g_current_test,(_Rb_tree_header *)p_Var8 != p_Var1,
                       "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/dyndep_parser_test.cc"
                       ,0x1b1,"i != dyndep_file_.end()");
    if (bVar4) {
      testing::Test::Check
                (g_current_test,*(char *)((long)&p_Var8[1]._M_parent + 1) == '\0',
                 "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/dyndep_parser_test.cc"
                 ,0x1b2,"false == i->second.restat_");
      bVar4 = testing::Test::Check
                        (g_current_test,(long)p_Var8[2]._M_left - (long)p_Var8[2]._M_parent == 0x10,
                         "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/dyndep_parser_test.cc"
                         ,0x1b3,"2u == i->second.implicit_outputs_.size()");
      pTVar3 = g_current_test;
      if (bVar4) {
        iVar5 = std::__cxx11::string::compare(*(char **)p_Var8[2]._M_parent);
        testing::Test::Check
                  (pTVar3,iVar5 == 0,
                   "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/dyndep_parser_test.cc"
                   ,0x1b4,"\"impout1\" == i->second.implicit_outputs_[0]->path()");
        pTVar3 = g_current_test;
        iVar5 = std::__cxx11::string::compare((char *)(p_Var8[2]._M_parent)->_M_parent);
        testing::Test::Check
                  (pTVar3,iVar5 == 0,
                   "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/dyndep_parser_test.cc"
                   ,0x1b5,"\"impout2\" == i->second.implicit_outputs_[1]->path()");
        testing::Test::Check
                  (g_current_test,p_Var8[1]._M_right == p_Var8[1]._M_left,
                   "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/dyndep_parser_test.cc"
                   ,0x1b6,"0u == i->second.implicit_inputs_.size()");
        return;
      }
      g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
    }
    else {
      g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
    }
  }
  else {
    g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
  }
  return;
}

Assistant:

TEST_F(DyndepParserTest, ImplicitOuts) {
  ASSERT_NO_FATAL_FAILURE(AssertParse(
"ninja_dyndep_version = 1\n"
"build out | impout1 impout2 : dyndep\n"));

  EXPECT_EQ(1u, dyndep_file_.size());
  DyndepFile::iterator i = dyndep_file_.find(state_.edges_[0]);
  ASSERT_NE(i, dyndep_file_.end());
  EXPECT_EQ(false, i->second.restat_);
  ASSERT_EQ(2u, i->second.implicit_outputs_.size());
  EXPECT_EQ("impout1", i->second.implicit_outputs_[0]->path());
  EXPECT_EQ("impout2", i->second.implicit_outputs_[1]->path());
  EXPECT_EQ(0u, i->second.implicit_inputs_.size());
}